

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpolygon.cpp
# Opt level: O1

void __thiscall QPolygon::point(QPolygon *this,int index,int *x,int *y)

{
  QPoint QVar1;
  
  QVar1 = (this->super_QList<QPoint>).d.ptr[index];
  if (x != (int *)0x0) {
    *x = QVar1.xp.m_i.m_i;
  }
  if (y != (int *)0x0) {
    *y = QVar1.yp.m_i.m_i;
  }
  return;
}

Assistant:

void QPolygon::point(int index, int *x, int *y) const
{
    QPoint p = at(index);
    if (x)
        *x = (int)p.x();
    if (y)
        *y = (int)p.y();
}